

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
               (Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  pointer *pppEVar1;
  pointer ppEVar2;
  Field_operators *pFVar3;
  iterator iVar4;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar5;
  bool bVar6;
  int iVar7;
  Entry *pEVar8;
  pointer puVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  _Rb_tree_color _Var12;
  _Rb_tree_color _Var13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  pointer ppEVar18;
  uint uVar19;
  ID_index IVar20;
  _Rb_tree_color _Var21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  undefined1 local_1c8 [24];
  undefined **local_1b0;
  ulong local_1a8;
  shared_count sStack_1a0;
  char **local_198;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_190;
  _Rb_tree_node_base local_160;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x11d);
  get_column_content_via_iterators<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
            ((column_content<Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Column_types)2,_false,_false,_false>_>_>_>
              *)&local_190,col);
  if (local_190._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar6 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       local_190._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Base_ptr)((long)&local_190 + 8),
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar6 = false;
  }
  local_1c8[0] = bVar6;
  local_1c8._8_8_ = (_Base_ptr)0x0;
  local_1c8._16_8_ = (_Base_ptr)0x0;
  local_198 = (char **)&local_160;
  local_160._0_8_ = "get_column_content_via_iterators(col) == setcont";
  local_160._M_parent = (_Base_ptr)0x197dbb;
  local_1a8 = local_1a8 & 0xffffffffffffff00;
  local_1b0 = &PTR__lazy_ostream_001b97f0;
  sStack_1a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 0x10));
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_190);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11e);
  uVar14 = (uint)((ulong)((long)(veccont->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(veccont->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar16 = uVar14;
  if ((int)uVar14 < 0) {
    ppEVar18 = (col->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((col->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppEVar18) {
      local_1c8._0_8_ = (_Base_ptr)0x0;
      local_1c8._8_8_ = (_Base_ptr)0x0;
      local_1c8._16_8_ = (_Base_ptr)0x0;
      goto LAB_0013d192;
    }
    uVar16 = (*ppEVar18)->rowIndex_ + 1;
  }
  local_190._M_impl._0_8_ = local_190._M_impl._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,(long)(int)uVar16,
             (value_type_conflict *)&local_190,(allocator_type *)&local_160);
  ppEVar18 = (col->column_).
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (col->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar18 != ppEVar2) {
    pFVar3 = col->operators_;
    do {
      uVar19 = (*ppEVar18)->rowIndex_;
      if (uVar19 < uVar16) {
        _Var13 = ((*ppEVar18)->super_Entry_field_element_option).element_;
        _Var12 = ((_Rb_tree_color *)local_1c8._0_8_)[uVar19];
        _Var21 = pFVar3->characteristic_;
        if (_Var21 <= _Var12) {
          _Var12 = _Var12 % _Var21;
        }
        if (_Var21 <= _Var13) {
          _Var13 = _Var13 % _Var21;
        }
        if (CARRY4(_Var12,_Var13)) {
          _Var13 = (_Var12 - _Var21) + _Var13;
        }
        else {
          if (_Var12 + _Var13 < _Var21) {
            _Var21 = _S_red;
          }
          _Var13 = (_Var12 + _Var13) - _Var21;
        }
        ((_Rb_tree_color *)local_1c8._0_8_)[uVar19] = _Var13;
      }
      ppEVar18 = ppEVar18 + 1;
    } while (ppEVar18 != ppEVar2);
  }
  p_Var10 = (_Base_ptr)local_1c8._8_8_;
  if ((int)uVar14 < 0) {
    do {
      local_1c8._8_8_ = p_Var10;
      if (local_1c8._0_8_ == local_1c8._8_8_) break;
      p_Var10 = (_Base_ptr)((long)&((_Base_ptr)(local_1c8._8_8_ + -0x20))->_M_right + 4);
    } while (p_Var10->_M_color == _S_red);
  }
LAB_0013d192:
  puVar9 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (local_1c8._8_8_ - local_1c8._0_8_ ==
      (long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar9) {
    if (local_1c8._8_8_ == local_1c8._0_8_) {
      bVar6 = true;
    }
    else {
      iVar7 = bcmp((void *)local_1c8._0_8_,puVar9,local_1c8._8_8_ - local_1c8._0_8_);
      bVar6 = iVar7 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar6);
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_160._0_8_ = "col.get_content(veccont.size()) == veccont";
  local_160._M_parent = (_Base_ptr)0x197de6;
  local_190._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_190._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
  local_190._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_190._M_impl.super__Rb_tree_header._M_header._M_left = &local_160;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  if ((_Base_ptr)local_1c8._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_98 = "";
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x124);
    pEVar8 = Gudhi::persistence_matrix::
             Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             ::_pop_pivot(col);
    if (pEVar8 != (Entry *)0x0) {
      iVar4._M_current =
           (col->column_).
           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (col->column_).
          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_190._M_impl._0_8_ = pEVar8;
        std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
        ::
        _M_realloc_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*const&>
                  ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
                    *)&col->column_,iVar4,
                   (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    **)&local_190);
      }
      else {
        *iVar4._M_current = pEVar8;
        pppEVar1 = &(col->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      ppEVar18 = (col->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 = (col->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pEVar5 = ppEVar2[-1];
      lVar17 = (long)ppEVar2 - (long)ppEVar18 >> 3;
      lVar15 = lVar17 + -1;
      if (1 < lVar17) {
        uVar16 = pEVar5->rowIndex_;
        do {
          lVar17 = (lVar15 - (lVar15 + -1 >> 0x3f)) + -1 >> 1;
          if (uVar16 <= ppEVar18[lVar17]->rowIndex_) break;
          ppEVar18[lVar15] = ppEVar18[lVar17];
          bVar6 = 2 < lVar15;
          lVar15 = lVar17;
        } while (bVar6);
      }
      ppEVar18[lVar15] = pEVar5;
    }
    local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,pEVar8 == (Entry *)0x0);
    local_1a8 = 0;
    sStack_1a0.pi_ = (sp_counted_base *)0x0;
    local_1c8._0_8_ = "col.is_empty()";
    local_1c8._8_8_ = "";
    local_190._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_190._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
    local_190._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_190._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1c8;
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_b8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x126);
    pEVar8 = Gudhi::persistence_matrix::
             Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             ::_pop_pivot(col);
    if (pEVar8 != (Entry *)0x0) {
      iVar4._M_current =
           (col->column_).
           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (col->column_).
          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_190._M_impl._0_8_ = pEVar8;
        std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
        ::
        _M_realloc_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*const&>
                  ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
                    *)&col->column_,iVar4,
                   (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    **)&local_190);
      }
      else {
        *iVar4._M_current = pEVar8;
        pppEVar1 = &(col->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      ppEVar18 = (col->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 = (col->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pEVar5 = ppEVar2[-1];
      lVar17 = (long)ppEVar2 - (long)ppEVar18 >> 3;
      lVar15 = lVar17 + -1;
      if (1 < lVar17) {
        uVar16 = pEVar5->rowIndex_;
        do {
          lVar17 = (lVar15 - (lVar15 + -1 >> 0x3f)) + -1 >> 1;
          if (uVar16 <= ppEVar18[lVar17]->rowIndex_) break;
          ppEVar18[lVar15] = ppEVar18[lVar17];
          bVar6 = 2 < lVar15;
          lVar15 = lVar17;
        } while (bVar6);
      }
      ppEVar18[lVar15] = pEVar5;
    }
    local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,pEVar8 != (Entry *)0x0);
    local_1a8 = 0;
    sStack_1a0.pi_ = (sp_counted_base *)0x0;
    local_1c8._0_8_ = "!col.is_empty()";
    local_1c8._8_8_ = "";
    local_190._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_190._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
    local_190._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_190._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1c8;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  puVar9 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    uVar11 = 0;
    do {
      IVar20 = (ID_index)uVar11;
      if (puVar9[uVar11] == 0) {
        local_100 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_f8 = "";
        local_110 = &boost::unit_test::basic_cstring<char_const>::null;
        local_108 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x12a);
        ppEVar18 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 = (col->column_).
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppEVar18 == ppEVar2) {
          bVar6 = true;
        }
        else {
          uVar16 = 0;
          do {
            if ((*ppEVar18)->rowIndex_ == IVar20) {
              uVar14 = ((*ppEVar18)->super_Entry_field_element_option).element_;
              uVar19 = col->operators_->characteristic_;
              if (uVar19 <= uVar16) {
                uVar16 = uVar16 % uVar19;
              }
              if (uVar19 <= uVar14) {
                uVar14 = uVar14 % uVar19;
              }
              if (CARRY4(uVar16,uVar14)) {
                uVar16 = (uVar16 - uVar19) + uVar14;
              }
              else {
                if (uVar16 + uVar14 < uVar19) {
                  uVar19 = 0;
                }
                uVar16 = (uVar16 + uVar14) - uVar19;
              }
            }
            ppEVar18 = ppEVar18 + 1;
          } while (ppEVar18 != ppEVar2);
          bVar6 = uVar16 == 0;
        }
        local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar6);
        local_1a8 = 0;
        sStack_1a0.pi_ = (sp_counted_base *)0x0;
        local_1c8._0_8_ = "!col.is_non_zero(i)";
        local_1c8._8_8_ = "";
        local_190._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
        local_190._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
        local_190._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_190._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1c8;
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        boost::test_tools::tt_detail::report_assertion(&local_1b0,&local_190,&local_120,0x12a,1,0,0)
        ;
      }
      else {
        local_130 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_128 = "";
        local_140 = &boost::unit_test::basic_cstring<char_const>::null;
        local_138 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,300);
        ppEVar18 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 = (col->column_).
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar11 = 0;
        if (ppEVar18 != ppEVar2) {
          do {
            uVar16 = (uint)uVar11;
            if ((*ppEVar18)->rowIndex_ == IVar20) {
              uVar14 = ((*ppEVar18)->super_Entry_field_element_option).element_;
              uVar19 = col->operators_->characteristic_;
              if (uVar19 <= uVar16) {
                uVar16 = (uint)(uVar11 % (ulong)uVar19);
              }
              if (uVar19 <= uVar14) {
                uVar14 = uVar14 % uVar19;
              }
              if (CARRY4(uVar16,uVar14)) {
                uVar11 = (ulong)((uVar16 - uVar19) + uVar14);
              }
              else {
                if (uVar16 + uVar14 < uVar19) {
                  uVar19 = 0;
                }
                uVar11 = (ulong)((uVar16 + uVar14) - uVar19);
              }
            }
            ppEVar18 = ppEVar18 + 1;
          } while (ppEVar18 != ppEVar2);
          uVar11 = (ulong)((int)uVar11 != 0);
        }
        local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,(char)uVar11);
        local_1a8 = 0;
        sStack_1a0.pi_ = (sp_counted_base *)0x0;
        local_1c8._0_8_ = "col.is_non_zero(i)";
        local_1c8._8_8_ = "";
        local_190._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
        local_190._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
        local_190._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_190._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1c8;
        local_160._M_left = (_Base_ptr)0x1942dd;
        local_160._M_right = (_Base_ptr)0x194350;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1b0,&local_190,&local_160._M_left,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1a0);
      uVar11 = (ulong)(IVar20 + 1);
      puVar9 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(veccont->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2))
    ;
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}